

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O0

void update_regset_by_reg(OnigRegSet *set,regex_t *reg)

{
  uint uVar1;
  bool bVar2;
  uint local_24;
  uint local_20;
  OnigLen anc_dmax;
  OnigLen anc_dmin;
  int anchor;
  regex_t *reg_local;
  OnigRegSet *set_local;
  
  if (set->n == 1) {
    set->enc = reg->enc;
    set->anchor = reg->anchor;
    set->anc_dmin = reg->anc_dist_min;
    set->anc_dmax = reg->anc_dist_max;
    bVar2 = true;
    if (reg->optimize != 0) {
      bVar2 = reg->dist_max == 0xffffffff;
    }
    set->all_low_high = (uint)!bVar2;
    set->anychar_inf = (uint)((reg->anchor & 0x4000U) != 0);
  }
  else {
    uVar1 = set->anchor & reg->anchor;
    if (uVar1 != 0) {
      local_20 = set->anc_dmin;
      local_24 = set->anc_dmax;
      if (reg->anc_dist_min < local_20) {
        local_20 = reg->anc_dist_min;
      }
      if (local_24 < reg->anc_dist_max) {
        local_24 = reg->anc_dist_max;
      }
      set->anc_dmin = local_20;
      set->anc_dmax = local_24;
    }
    set->anchor = uVar1;
    if ((reg->optimize == 0) || (reg->dist_max == 0xffffffff)) {
      set->all_low_high = 0;
    }
    if ((reg->anchor & 0x4000U) != 0) {
      set->anychar_inf = 1;
    }
  }
  return;
}

Assistant:

static void
update_regset_by_reg(OnigRegSet* set, regex_t* reg)
{
  if (set->n == 1) {
    set->enc          = reg->enc;
    set->anchor       = reg->anchor;
    set->anc_dmin     = reg->anc_dist_min;
    set->anc_dmax     = reg->anc_dist_max;
    set->all_low_high =
      (reg->optimize == OPTIMIZE_NONE || reg->dist_max == INFINITE_LEN) ? 0 : 1;
    set->anychar_inf  = (reg->anchor & ANCR_ANYCHAR_INF) != 0 ? 1 : 0;
  }
  else {
    int anchor;

    anchor = set->anchor & reg->anchor;
    if (anchor != 0) {
      OnigLen anc_dmin;
      OnigLen anc_dmax;

      anc_dmin = set->anc_dmin;
      anc_dmax = set->anc_dmax;
      if (anc_dmin > reg->anc_dist_min) anc_dmin = reg->anc_dist_min;
      if (anc_dmax < reg->anc_dist_max) anc_dmax = reg->anc_dist_max;
      set->anc_dmin = anc_dmin;
      set->anc_dmax = anc_dmax;
    }

    set->anchor = anchor;

    if (reg->optimize == OPTIMIZE_NONE || reg->dist_max == INFINITE_LEN)
      set->all_low_high = 0;

    if ((reg->anchor & ANCR_ANYCHAR_INF) != 0)
      set->anychar_inf = 1;
  }
}